

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_set_element.h
# Opt level: O3

void __thiscall label_set_converter::StructuralVector::StructuralVector(StructuralVector *this)

{
  this->postorder_id = 0;
  this->number_nodes_left = 0;
  this->number_nodes_right = 0;
  this->number_nodes_ancestor = 0;
  this->number_nodes_descendant = 0;
  return;
}

Assistant:

label_set_converter::StructuralVector::StructuralVector() {}